

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::setActive(QUndoStack *this,bool active)

{
  long lVar1;
  QUndoStack *pQVar2;
  QUndoGroup *this_00;
  
  lVar1 = *(long *)&this->field_0x8;
  this_00 = *(QUndoGroup **)(lVar1 + 0xb0);
  if (this_00 == (QUndoGroup *)0x0) {
    return;
  }
  if (!active) {
    pQVar2 = QUndoGroup::activeStack(this_00);
    if (pQVar2 != this) {
      return;
    }
    this_00 = *(QUndoGroup **)(lVar1 + 0xb0);
    this = (QUndoStack *)0x0;
  }
  QUndoGroup::setActiveStack(this_00,this);
  return;
}

Assistant:

void QUndoStack::setActive(bool active)
{
#if !QT_CONFIG(undogroup)
    Q_UNUSED(active);
#else
    Q_D(QUndoStack);

    if (d->group != nullptr) {
        if (active)
            d->group->setActiveStack(this);
        else if (d->group->activeStack() == this)
            d->group->setActiveStack(nullptr);
    }
#endif
}